

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.cxx
# Opt level: O0

int main(void)

{
  PressedKey PVar1;
  __sighandler_t p_Var2;
  char *pcVar3;
  undefined8 uVar4;
  exception *e;
  PressedKey key;
  LinuxKeys linuxKeys;
  Bitmap pixels;
  OledI2C oled;
  string what;
  value_type_conflict signal;
  const_iterator __end1;
  const_iterator __begin1;
  array<int,_2UL> *__range1;
  array<int,_2UL> signals;
  LinuxKeys *in_stack_fffffffffffff638;
  OledI2C *in_stack_fffffffffffff640;
  OledBitmap<128,_64> *in_stack_fffffffffffff650;
  allocator *paVar5;
  LinuxKeys *in_stack_fffffffffffff680;
  Point<int> local_970;
  PressedKey local_968;
  PressedKey local_960 [2];
  OledPixel *in_stack_fffffffffffff6b0;
  OledPixel *in_stack_fffffffffffff6b8;
  OledPoint in_stack_fffffffffffff6c0;
  string *in_stack_fffffffffffff6c8;
  error_category *in_stack_fffffffffffff6d0;
  int in_stack_fffffffffffff6dc;
  system_error *in_stack_fffffffffffff6e0;
  Point<int> local_918 [5];
  OledI2C *in_stack_fffffffffffff710;
  uint8_t in_stack_fffffffffffff837;
  string *in_stack_fffffffffffff838;
  OledI2C *in_stack_fffffffffffff840;
  Bitmap *in_stack_fffffffffffffab0;
  allocator local_501;
  string local_500 [40];
  OledI2C local_4d8;
  allocator local_51;
  string local_50 [36];
  int local_2c;
  int *local_28;
  int *local_20;
  undefined8 *local_18;
  undefined8 local_c;
  undefined4 local_4;
  
  local_4 = 0;
  local_c = 0xf00000002;
  local_18 = &local_c;
  local_20 = std::array<int,_2UL>::begin((array<int,_2UL> *)0x10797e);
  local_28 = std::array<int,_2UL>::end((array<int,_2UL> *)0x107993);
  while( true ) {
    if (local_20 == local_28) {
      paVar5 = &local_501;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_500,"/dev/i2c-1",paVar5);
      SSD1306::OledI2C::OledI2C
                (in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff837);
      std::__cxx11::string::~string(local_500);
      std::allocator<char>::~allocator((allocator<char> *)&local_501);
      SSD1306::OledBitmap<128,_64>::OledBitmap(in_stack_fffffffffffff650);
      newLife((OledPixel *)paVar5);
      SSD1306::Point<int>::Point(local_918,0,0);
      SSD1306::OledPixel::setFrom
                (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,in_stack_fffffffffffff6c0);
      SSD1306::OledI2C::displayUpdate(in_stack_fffffffffffff710);
      LinuxKeys::LinuxKeys(in_stack_fffffffffffff680);
      LinuxKeys::PressedKey::PressedKey(local_960,false,0);
      while ((anonymous_namespace)::run != 0) {
        local_968 = LinuxKeys::pressed(in_stack_fffffffffffff638);
        local_960[0] = local_968;
        if (((ulong)local_968 & 1) != 0) {
          local_960[0].key = local_968.key;
          PVar1 = local_968;
          switch(local_960[0].key) {
          case 0x1b:
            (anonymous_namespace)::run = 0;
            PVar1 = local_968;
            break;
          case 0x20:
            newLife((OledPixel *)paVar5);
            PVar1 = local_960[0];
            break;
          case 0x2b:
            SSD1306::OledI2C::displayOn((OledI2C *)0x107d47);
            PVar1 = local_960[0];
            break;
          case 0x2d:
            SSD1306::OledI2C::displayOff((OledI2C *)0x107d58);
            PVar1 = local_960[0];
          }
          local_960[0] = PVar1;
        }
        iterateLife(in_stack_fffffffffffffab0);
        in_stack_fffffffffffff640 = &local_4d8;
        SSD1306::Point<int>::Point(&local_970,0,0);
        SSD1306::OledPixel::setFrom
                  (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,in_stack_fffffffffffff6c0);
        SSD1306::OledI2C::displayUpdate(in_stack_fffffffffffff710);
      }
      SSD1306::OledI2C::clear((OledI2C *)0x107dce);
      SSD1306::OledI2C::displayUpdate(in_stack_fffffffffffff710);
      LinuxKeys::~LinuxKeys((LinuxKeys *)0x107de9);
      SSD1306::OledBitmap<128,_64>::~OledBitmap((OledBitmap<128,_64> *)0x107df6);
      SSD1306::OledI2C::~OledI2C(in_stack_fffffffffffff640);
      return 0;
    }
    local_2c = *local_20;
    p_Var2 = ::signal(local_2c,signalHandler);
    if (p_Var2 == (__sighandler_t)0xffffffffffffffff) break;
    local_20 = local_20 + 1;
  }
  paVar5 = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"installing ",paVar5);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar3 = strsignal(local_2c);
  std::__cxx11::string::operator+=(local_50,pcVar3);
  std::__cxx11::string::operator+=(local_50," signal handler");
  uVar4 = __cxa_allocate_exception(0x20);
  __errno_location();
  std::_V2::system_category();
  std::system_error::system_error
            (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d0,
             in_stack_fffffffffffff6c8);
  __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

int
main()
{
    try
    {
        constexpr std::array<int, 2> signals{SIGINT, SIGTERM};

        for (auto signal : signals)
        {
            if (std::signal(signal, signalHandler) == SIG_ERR)
            {
                std::string what{"installing "};
                what += strsignal(signal);
                what += " signal handler";

                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }
        }

       SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        Bitmap pixels;

        newLife(pixels);
        oled.setFrom(pixels);
        oled.displayUpdate();

        LinuxKeys linuxKeys;
        LinuxKeys::PressedKey key;

        //-----------------------------------------------------------------

        while (run)
        {
            key = linuxKeys.pressed();
        
            if (key.isPressed)
            {
                switch (key.key)
                {
                case ' ':

                    newLife(pixels);
                    break;

                case '+':

                    oled.displayOn();
                    break;

                case '-':

                    oled.displayOff();
                    break;

                case 27:

                    run = 0;
                    break;
                }
            }

            iterateLife(pixels);
            oled.setFrom(pixels);
            oled.displayUpdate();
        }

        //-----------------------------------------------------------------

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}